

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

Matrix * rw::Matrix::transpose(Matrix *dst,Matrix *src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  
  if ((src->flags & 0x20000) != 0) {
    fVar10 = (src->right).x;
    fVar11 = (src->right).y;
    uVar1 = *(undefined8 *)&(src->right).z;
    fVar8 = (src->up).x;
    fVar9 = (src->up).y;
    uVar2 = *(undefined8 *)&(src->up).z;
    fVar6 = (src->at).x;
    fVar7 = (src->at).y;
    uVar3 = *(undefined8 *)&(src->at).z;
    fVar5 = (src->pos).y;
    uVar4 = *(undefined8 *)&(src->pos).z;
    (dst->pos).x = (src->pos).x;
    (dst->pos).y = fVar5;
    *(undefined8 *)&(dst->pos).z = uVar4;
    (dst->at).x = fVar6;
    (dst->at).y = fVar7;
    *(undefined8 *)&(dst->at).z = uVar3;
    (dst->up).x = fVar8;
    (dst->up).y = fVar9;
    *(undefined8 *)&(dst->up).z = uVar2;
    (dst->right).x = fVar10;
    (dst->right).y = fVar11;
    *(undefined8 *)&(dst->right).z = uVar1;
  }
  (dst->right).x = (src->right).x;
  (dst->up).x = (src->right).y;
  (dst->at).x = (src->right).z;
  (dst->right).y = (src->up).x;
  (dst->up).y = (src->up).y;
  (dst->at).y = (src->up).z;
  (dst->right).z = (src->at).x;
  (dst->up).z = (src->at).y;
  (dst->at).z = (src->at).z;
  (dst->pos).x = 0.0;
  (dst->pos).y = 0.0;
  (dst->pos).z = 0.0;
  return dst;
}

Assistant:

Matrix*
Matrix::transpose(Matrix *dst, const Matrix *src)
{
	if(src->flags & IDENTITY)
		*dst = *src;
	dst->right.x = src->right.x;
	dst->up.x = src->right.y;
	dst->at.x = src->right.z;
	dst->right.y = src->up.x;
	dst->up.y = src->up.y;
	dst->at.y = src->up.z;
	dst->right.z = src->at.x;
	dst->up.z = src->at.y;
	dst->at.z = src->at.z;
	dst->pos.x = 0.0;
	dst->pos.y = 0.0;
	dst->pos.z = 0.0;
	return dst;
}